

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O1

vector<Post,_std::allocator<Post>_> * __thiscall
Database::getLikedPostsForUser
          (vector<Post,_std::allocator<Post>_> *__return_storage_ptr__,Database *this,int userId)

{
  uint uVar1;
  int iVar2;
  long *plVar3;
  DatabaseException *this_00;
  uint uVar4;
  size_type *psVar5;
  long *plVar6;
  ulong uVar7;
  uint __val;
  uint __len;
  char *errorMsg;
  string error;
  string query;
  string __str;
  char *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b8 = (char *)0x0;
  (__return_storage_ptr__->super__Vector_base<Post,_std::allocator<Post>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Post,_std::allocator<Post>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Post,_std::allocator<Post>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __val = -userId;
  if (0 < userId) {
    __val = userId;
  }
  __len = 1;
  if (9 < __val) {
    uVar7 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar4 = (uint)uVar7;
      if (uVar4 < 100) {
        __len = __len - 2;
        goto LAB_001a4ae9;
      }
      if (uVar4 < 1000) {
        __len = __len - 1;
        goto LAB_001a4ae9;
      }
      if (uVar4 < 10000) goto LAB_001a4ae9;
      uVar7 = uVar7 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar4);
    __len = __len + 1;
  }
LAB_001a4ae9:
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct((ulong)local_70,(char)__len - (char)(userId >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_70[0] + ((uint)userId >> 0x1f),__len,__val);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x1b56e0);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_b0.field_2._M_allocated_capacity = *psVar5;
    local_b0.field_2._8_8_ = plVar3[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar5;
    local_b0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_b0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_80 = *plVar6;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar6;
    local_90 = (long *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  iVar2 = sqlite3_exec(this->database,(char *)local_90,add_post_callback,__return_storage_ptr__,
                       &local_b8);
  if (iVar2 == 0) {
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)&local_b0,local_b8,(allocator *)local_70);
  sqlite3_free(local_b8);
  this_00 = (DatabaseException *)__cxa_allocate_exception(0x28);
  std::operator+(&local_50,"Error while getting liked posts for user: ",&local_b0);
  DatabaseException::DatabaseException(this_00,&local_50);
  __cxa_throw(this_00,&DatabaseException::typeinfo,DatabaseException::~DatabaseException);
}

Assistant:

std::vector<Post> Database::getLikedPostsForUser(int userId)
{
	char* errorMsg = nullptr;
	std::vector<Post> result;
	std::string query = "select * from posts inner join likes on likes.post_id = posts.id "
			"where likes.user_id = " + std::to_string(userId) + ";";

	int retval = sqlite3_exec(database, query.c_str(), add_post_callback, &result, &errorMsg);

	if(retval != SQLITE_OK)
	{
		std::string error(errorMsg);
		sqlite3_free(errorMsg);
		throw DatabaseException("Error while getting liked posts for user: " + error);
	}
	else
	{
		return result;
	}
}